

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

void __thiscall
Diligent::
PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
::PipelineStateCreateInfoX
          (PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
           *this)

{
  PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  *this_local;
  
  RayTracingPipelineStateCreateInfo::RayTracingPipelineStateCreateInfo
            (&this->super_RayTracingPipelineStateCreateInfo);
  PipelineResourceLayoutDescX::PipelineResourceLayoutDescX(&this->ResourceLayout);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->StringPool);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>_>_>
  ::vector(&this->Objects);
  std::
  vector<Diligent::IPipelineResourceSignature_*,_std::allocator<Diligent::IPipelineResourceSignature_*>_>
  ::vector(&this->Signatures);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)&this->InternalData
            );
  return;
}

Assistant:

PipelineStateCreateInfoX() noexcept
    {}